

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::setOption(Context *this,char *option,char *value)

{
  char *local_e0;
  char *lvalue;
  String local_c0;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  undefined1 local_38 [8];
  String argv;
  char *value_local;
  char *option_local;
  Context *this_local;
  
  argv.field_0._16_8_ = value;
  String::String(&local_80,"-");
  String::String(&local_98,option);
  operator+(&local_68,&local_80,&local_98);
  String::String(&local_c0,"=");
  operator+(&local_50,&local_68,&local_c0);
  String::String((String *)&lvalue,(char *)argv.field_0._16_8_);
  operator+((String *)local_38,&local_50,(String *)&lvalue);
  String::~String((String *)&lvalue);
  String::~String(&local_50);
  String::~String(&local_c0);
  String::~String(&local_68);
  String::~String(&local_98);
  String::~String(&local_80);
  local_e0 = String::c_str((String *)local_38);
  parseArgs(this,1,&local_e0,false);
  String::~String((String *)local_38);
  return;
}

Assistant:

void Context::setOption(const char* option, const char* value) {
    auto argv   = String("-") + option + "=" + value;
    auto lvalue = argv.c_str();
    parseArgs(1, &lvalue);
}